

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

void __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EmitBr
          (BinaryReaderInterp *this,Index depth,Index drop_count,Index keep_count)

{
  u32 val;
  pointer pLVar1;
  pointer pLVar2;
  Offset offset;
  long lVar3;
  ulong uVar4;
  
  Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->label_stack_).
                super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  if ((ulong)depth < (ulong)(lVar3 >> 3)) {
    uVar4 = ~(ulong)depth;
    val = *(u32 *)((long)pLVar1 + uVar4 * 8 + lVar3);
    Istream::Emit(this->istream_,Br);
    if (val == 0xffffffff) {
      pLVar1 = (this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pLVar2 = (this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_start;
      offset = Istream::end(this->istream_);
      FixupMap::Append(&this->depth_fixups_,
                       (int)uVar4 + (int)((ulong)((long)pLVar1 - (long)pLVar2) >> 3),offset);
    }
    Istream::Emit(this->istream_,val);
    return;
  }
  __assert_fail("depth < label_stack_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x150,
                "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)");
}

Assistant:

void BinaryReaderInterp::EmitBr(Index depth,
                                Index drop_count,
                                Index keep_count) {
  istream_.EmitDropKeep(drop_count, keep_count);
  Istream::Offset offset = GetLabel(depth)->offset;
  istream_.Emit(Opcode::Br);
  if (offset == Istream::kInvalidOffset) {
    // depth_fixups_ stores the depth counting up from zero, where zero is the
    // top-level function scope.
    depth_fixups_.Append(label_stack_.size() - 1 - depth, istream_.end());
  }
  istream_.Emit(offset);
}